

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::ChainPromiseNode::onReady(ChainPromiseNode *this,Event *event)

{
  int iVar1;
  
  iVar1 = *(int *)&(this->super_Event).field_0x24;
  if (iVar1 == 1) {
    (**((this->inner).ptr)->_vptr_PromiseNode)();
    return;
  }
  if (iVar1 == 0) {
    this->onReadyEvent = event;
    return;
  }
  unreachable();
}

Assistant:

void ChainPromiseNode::onReady(Event* event) noexcept {
  switch (state) {
    case STEP1:
      onReadyEvent = event;
      return;
    case STEP2:
      inner->onReady(event);
      return;
  }
  KJ_UNREACHABLE;
}